

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTEventLog.h
# Opt level: O0

WeakCollectionContainsEventLogEntry * __thiscall
TTD::EventLog::
ReplayGetReplayEvent_Helper<TTD::NSLogEvents::WeakCollectionContainsEventLogEntry,(TTD::NSLogEvents::EventKind)10>
          (EventLog *this)

{
  bool bVar1;
  EventLogEntry *pEVar2;
  WeakCollectionContainsEventLogEntry *pWVar3;
  EventLogEntry *evt;
  EventLog *this_local;
  
  bVar1 = TTEventList::Iterator::IsValid(&this->m_currentReplayEventIterator);
  if (!bVar1) {
    AbortReplayReturnToHost(this);
  }
  pEVar2 = TTEventList::Iterator::Current(&this->m_currentReplayEventIterator);
  if (pEVar2->EventTimeStamp != this->m_eventTimeCtr) {
    TTDAbort_unrecoverable_error("Out of Sync!!!");
  }
  pEVar2 = TTEventList::Iterator::Current(&this->m_currentReplayEventIterator);
  AdvanceTimeAndPositionForReplay(this);
  pWVar3 = NSLogEvents::
           GetInlineEventDataAs<TTD::NSLogEvents::WeakCollectionContainsEventLogEntry,(TTD::NSLogEvents::EventKind)10>
                     (pEVar2);
  return pWVar3;
}

Assistant:

const T* ReplayGetReplayEvent_Helper()
        {
            if(!this->m_currentReplayEventIterator.IsValid())
            {
                this->AbortReplayReturnToHost();
            }

#if ENABLE_TTD_INTERNAL_DIAGNOSTICS
            TTDAssert(this->m_currentReplayEventIterator.Current()->EventTimeStamp == this->m_eventTimeCtr, "Out of Sync!!!");
#endif

            const NSLogEvents::EventLogEntry* evt = this->m_currentReplayEventIterator.Current();

            this->AdvanceTimeAndPositionForReplay();

            return NSLogEvents::GetInlineEventDataAs<T, tag>(evt);
        }